

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O1

void __thiscall
bssl::HPKETest_SetupSenderWrongLengthPeerPublicValue_Test::TestBody
          (HPKETest_SetupSenderWrongLengthPeerPublicValue_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  ulong uVar2;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  uint8_t bogus_public_key_r [37];
  size_t enc_len;
  uint8_t enc [32];
  ScopedEVP_HPKE_CTX sender_ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_368;
  AssertHelper local_360;
  internal local_358 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  string local_348;
  uint8_t local_328 [40];
  size_t local_300;
  uint8_t local_2f8 [32];
  EVP_HPKE_CTX local_2d8;
  
  local_328[8] = '\0';
  local_328[9] = '\0';
  local_328[10] = '\0';
  local_328[0xb] = '\0';
  local_328[0xc] = '\0';
  local_328[0xd] = '\0';
  local_328[0xe] = '\0';
  local_328[0xf] = '\0';
  local_328[0x10] = '\0';
  local_328[0x11] = '\0';
  local_328[0x12] = '\0';
  local_328[0x13] = '\0';
  local_328[0x14] = '\0';
  local_328[0x15] = '\0';
  local_328[0x16] = '\0';
  local_328[0x17] = '\0';
  local_328[0x18] = '\0';
  local_328[0x19] = '\0';
  local_328[0x1a] = '\0';
  local_328[0x1b] = '\0';
  local_328[0x1c] = '\0';
  local_328[0x1d] = '\0';
  local_328[0x1e] = '\0';
  local_328[0x1f] = '\0';
  local_328[0x20] = '\0';
  local_328[0x21] = '\0';
  local_328[0x22] = '\0';
  local_328[0x23] = '\0';
  local_328[0x24] = '\0';
  local_328[0] = 0xff;
  local_328[1] = '\0';
  local_328[2] = '\0';
  local_328[3] = '\0';
  local_328[4] = '\0';
  local_328[5] = '\0';
  local_328[6] = '\0';
  local_328[7] = '\0';
  EVP_HPKE_CTX_zero(&local_2d8);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  iVar1 = EVP_HPKE_CTX_setup_sender
                    (&local_2d8,local_2f8,&local_300,0x20,kem,kdf,aead,local_328,0x25,(uint8_t *)0x0
                     ,0);
  local_358[0] = (internal)(iVar1 == 0);
  local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_358[0]) {
    uVar2 = ERR_get_error();
    ErrorEquals((uint32_t)local_358,(int)uVar2,6);
    if (local_358[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_368);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_348,local_358,
                 (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_EVP, 134)","false","true",
                 (char *)kdf);
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x27a,local_348._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_368);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if (local_368._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_368._M_head_impl + 8))();
      }
    }
    if (local_350 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_350,local_350);
    }
    ERR_clear_error();
  }
  else {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_348,local_358,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), bogus_public_key_r, sizeof(bogus_public_key_r), nullptr, 0)"
               ,"true","false",(char *)kdf);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x278,local_348._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
    if (local_350 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_350,local_350);
    }
  }
  EVP_HPKE_CTX_cleanup(&local_2d8);
  return;
}

Assistant:

TEST(HPKETest, SetupSenderWrongLengthPeerPublicValue) {
  const uint8_t bogus_public_key_r[X25519_PRIVATE_KEY_LEN + 5] = {0xff};
  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN];
  size_t enc_len;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), bogus_public_key_r, sizeof(bogus_public_key_r),
      nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_PEER_KEY));
  ERR_clear_error();
}